

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbol(DescriptorBuilder *this,string *name,bool build_it)

{
  pointer file_00;
  bool bVar1;
  size_type sVar2;
  DescriptorBuilder *pDVar3;
  DescriptorBuilder *this_00;
  DescriptorBuilder *pDVar4;
  Symbol *this_01;
  FileDescriptor *file;
  Symbol result;
  FileDescriptor *local_38;
  Symbol local_30;
  
  local_30 = FindSymbolNotEnforcingDeps(this,name,build_it);
  if (local_30.ptr_ == (SymbolBase *)0x0) {
    return (Symbol)(SymbolBase *)0x0;
  }
  if ((local_30.ptr_)->symbol_type_ == '\0') {
    return (Symbol)local_30.ptr_;
  }
  if (this->pool_->enforce_dependencies_ != true) {
    return (Symbol)local_30.ptr_;
  }
  this_01 = &local_30;
  local_38 = Symbol::GetFile(this_01);
  if (local_38 != this->file_) {
    this_00 = (DescriptorBuilder *)&this->dependencies_;
    sVar2 = std::
            set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::count((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *)this_00,&local_38);
    if (sVar2 == 0) {
      if ((local_30.ptr_ != (SymbolBase *)0x0) && ((local_30.ptr_)->symbol_type_ == '\t')) {
        bVar1 = IsInPackage(this_00,this->file_,name);
        if (bVar1) goto LAB_0036021a;
        pDVar4 = (DescriptorBuilder *)
                 (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while (pDVar4 != (DescriptorBuilder *)
                         &(this->dependencies_)._M_t._M_impl.super__Rb_tree_header) {
          file_00 = (pDVar4->options_to_interpret_).
                    super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((file_00 != (pointer)0x0) &&
             (bVar1 = IsInPackage(this_00,(FileDescriptor *)file_00,name), bVar1))
          goto LAB_0036021a;
          pDVar3 = (DescriptorBuilder *)std::_Rb_tree_increment((_Rb_tree_node_base *)pDVar4);
          this_00 = pDVar4;
          pDVar4 = pDVar3;
        }
      }
      this->possible_undeclared_dependency_ = local_38;
      std::__cxx11::string::_M_assign((string *)&this->possible_undeclared_dependency_name_);
      this_01 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
    }
  }
LAB_0036021a:
  return (Symbol)this_01->ptr_;
}

Assistant:

Symbol DescriptorBuilder::FindSymbol(const std::string& name, bool build_it) {
  Symbol result = FindSymbolNotEnforcingDeps(name, build_it);

  if (result.IsNull()) return result;

  if (!pool_->enforce_dependencies_) {
    // Hack for CompilerUpgrader, and also used for lazily_build_dependencies_
    return result;
  }

  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) {
    return result;
  }

  if (result.type() == Symbol::PACKAGE) {
    // Arg, this is overcomplicated.  The symbol is a package name.  It could
    // be that the package was defined in multiple files.  result.GetFile()
    // returns the first file we saw that used this package.  We've determined
    // that that file is not a direct dependency of the file we are currently
    // building, but it could be that some other file which *is* a direct
    // dependency also defines the same package.  We can't really rule out this
    // symbol unless none of the dependencies define it.
    if (IsInPackage(file_, name)) return result;
    for (std::set<const FileDescriptor*>::const_iterator it =
             dependencies_.begin();
         it != dependencies_.end(); ++it) {
      // Note:  A dependency may be nullptr if it was not found or had errors.
      if (*it != nullptr && IsInPackage(*it, name)) return result;
    }
  }

  possible_undeclared_dependency_ = file;
  possible_undeclared_dependency_name_ = name;
  return kNullSymbol;
}